

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_node::remove_child(xml_node *this,xml_node *n)

{
  xml_allocator *this_00;
  long *in_RSI;
  long *in_RDI;
  xml_node_struct *unaff_retaddr;
  xml_allocator *alloc;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar1;
  
  if (((*in_RDI == 0) || (*in_RSI == 0)) || (*(long *)(*in_RSI + 0x18) != *in_RDI)) {
    bVar1 = false;
  }
  else {
    this_00 = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>((xml_node_struct *)*in_RDI)
    ;
    bVar1 = impl::anon_unknown_0::xml_allocator::reserve(this_00);
    if (bVar1) {
      impl::anon_unknown_0::remove_node((xml_node_struct *)*in_RSI);
      impl::anon_unknown_0::destroy_node
                (unaff_retaddr,
                 (xml_allocator *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

PUGI_IMPL_FN bool xml_node::remove_child(const xml_node& n)
	{
		if (!_root || !n._root || n._root->parent != _root) return false;

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return false;

		impl::remove_node(n._root);
		impl::destroy_node(n._root, alloc);

		return true;
	}